

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

int bam_mplp_auto(bam_mplp_t iter,int *_tid,int *_pos,int *n_plp,bam_pileup1_t **plp)

{
  int iVar1;
  bam_pileup1_t *pbVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int pos;
  int tid;
  int local_48;
  uint local_44;
  int *local_40;
  int *local_38;
  
  local_40 = _tid;
  local_38 = _pos;
  if (iter->n < 1) {
    uVar6 = 0xffffffffffffffff;
  }
  else {
    uVar6 = 0xffffffffffffffff;
    lVar3 = 0;
    lVar5 = 0;
    do {
      if (*(uint64_t *)((long)iter->pos + lVar3 * 2) == iter->min) {
        pbVar2 = bam_plp_auto(*(bam_plp_t *)((long)iter->iter + lVar3 * 2),(int *)&local_44,
                              &local_48,(int *)((long)iter->n_plp + lVar3));
        *(bam_pileup1_t **)((long)iter->plp + lVar3 * 2) = pbVar2;
        if (*(int *)(*(long *)((long)iter->iter + lVar3 * 2) + 0x38) != 0) {
          return -1;
        }
        uVar4 = (long)local_48 | (ulong)local_44 << 0x20;
        if (*(long *)((long)iter->plp + lVar3 * 2) == 0) {
          uVar4 = 0;
        }
        *(ulong *)((long)iter->pos + lVar3 * 2) = uVar4;
      }
      if ((*(long *)((long)iter->plp + lVar3 * 2) != 0) &&
         (uVar4 = *(ulong *)((long)iter->pos + lVar3 * 2), uVar4 < uVar6)) {
        uVar6 = uVar4;
      }
      lVar5 = lVar5 + 1;
      lVar3 = lVar3 + 4;
    } while (lVar5 < iter->n);
  }
  iter->min = uVar6;
  iVar1 = 0;
  if (uVar6 != 0xffffffffffffffff) {
    *local_40 = (int)(uVar6 >> 0x20);
    *local_38 = (int)uVar6;
    iVar1 = 0;
    if (0 < iter->n) {
      lVar3 = 0;
      iVar1 = 0;
      do {
        if (iter->pos[lVar3] == uVar6) {
          n_plp[lVar3] = iter->n_plp[lVar3];
          plp[lVar3] = iter->plp[lVar3];
          iVar1 = iVar1 + 1;
        }
        else {
          n_plp[lVar3] = 0;
          plp[lVar3] = (bam_pileup1_t *)0x0;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < iter->n);
    }
  }
  return iVar1;
}

Assistant:

int bam_mplp_auto(bam_mplp_t iter, int *_tid, int *_pos, int *n_plp, const bam_pileup1_t **plp)
{
    int i, ret = 0;
    uint64_t new_min = (uint64_t)-1;
    for (i = 0; i < iter->n; ++i) {
        if (iter->pos[i] == iter->min) {
            int tid, pos;
            iter->plp[i] = bam_plp_auto(iter->iter[i], &tid, &pos, &iter->n_plp[i]);
            if ( iter->iter[i]->error ) return -1;
            iter->pos[i] = iter->plp[i] ? (uint64_t)tid<<32 | pos : 0;
        }
        if (iter->plp[i] && iter->pos[i] < new_min) new_min = iter->pos[i];
    }
    iter->min = new_min;
    if (new_min == (uint64_t)-1) return 0;
    *_tid = new_min>>32; *_pos = (uint32_t)new_min;
    for (i = 0; i < iter->n; ++i) {
        if (iter->pos[i] == iter->min) { // FIXME: valgrind reports "uninitialised value(s) at this line"
            n_plp[i] = iter->n_plp[i], plp[i] = iter->plp[i];
            ++ret;
        } else n_plp[i] = 0, plp[i] = 0;
    }
    return ret;
}